

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O0

char * __thiscall llbuild::core::BuildEngineTrace::getRuleName(BuildEngineTrace *this,Rule *rule)

{
  iterator __stream;
  bool bVar1;
  string *psVar2;
  undefined8 uVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined8 local_e8 [2];
  undefined8 local_d8;
  undefined8 local_d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined8 local_c0;
  string local_b8 [8];
  string encoded;
  _Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_88;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  result;
  char name [64];
  _Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_30;
  iterator it;
  FILE *fp;
  Rule *rule_local;
  BuildEngineTrace *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             )this->outputPtr;
  fp = (FILE *)rule;
  rule_local = (Rule *)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llbuild::core::Rule_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_llbuild::core::Rule_*>,_std::equal_to<const_llbuild::core::Rule_*>,_std::allocator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->ruleNames,(key_type *)&fp);
  name._56_8_ = std::
                unordered_map<const_llbuild::core::Rule_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_llbuild::core::Rule_*>,_std::equal_to<const_llbuild::core::Rule_*>,_std::allocator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&this->ruleNames);
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      *)(name + 0x38));
  if (bVar1) {
    std::__detail::
    _Node_iterator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  *)&local_30);
    this_local = (BuildEngineTrace *)std::__cxx11::string::c_str();
  }
  else {
    this->numNamedRules = this->numNamedRules + 1;
    snprintf(&result.second,0x40,"R%d");
    pVar4 = std::
            unordered_map<llbuild::core::Rule_const*,std::__cxx11::string,std::hash<llbuild::core::Rule_const*>,std::equal_to<llbuild::core::Rule_const*>,std::allocator<std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>>>
            ::emplace<llbuild::core::Rule_const*&,char(&)[64]>
                      ((unordered_map<llbuild::core::Rule_const*,std::__cxx11::string,std::hash<llbuild::core::Rule_const*>,std::equal_to<llbuild::core::Rule_const*>,std::allocator<std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>>>
                        *)&this->ruleNames,(Rule **)&fp,(char (*) [64])&result.second);
    encoded.field_2._8_8_ =
         pVar4.first.
         super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
         ._M_cur;
    result.first.
    super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_cur._0_1_ = pVar4.second;
    local_88._M_cur = (__node_type *)encoded.field_2._8_8_;
    psVar2 = KeyType::str_abi_cxx11_((KeyType *)(fp + 8));
    std::__cxx11::string::string(local_b8,(string *)psVar2);
    local_d0 = std::__cxx11::string::begin();
    local_d8 = std::__cxx11::string::end();
    local_c8 = std::
               remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,llbuild::core::BuildEngineTrace::getRuleName(llbuild::core::Rule_const*)::__0>
                         (local_d0,local_d8);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_c0,&local_c8);
    local_f0._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_e8,&local_f0);
    std::__cxx11::string::erase(local_b8,local_c0,local_e8[0]);
    __stream = it;
    uVar3 = std::__cxx11::string::c_str();
    fprintf((FILE *)__stream.
                    super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    ._M_cur,"{ \"new-rule\", \"%s\", \"%s\" },\n",&result.second,uVar3);
    std::__detail::
    _Node_iterator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  *)&local_88);
    this_local = (BuildEngineTrace *)std::__cxx11::string::c_str();
    std::__cxx11::string::~string(local_b8);
  }
  return (char *)this_local;
}

Assistant:

const char* BuildEngineTrace::getRuleName(const Rule* rule) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  // See if we have already assigned a name.
  auto it = ruleNames.find(rule);
  if (it != ruleNames.end())
    return it->second.c_str();

  // Otherwise, create a name.
  char name[64];
  snprintf(name, sizeof(name), "R%d", ++numNamedRules);
  auto result = ruleNames.emplace(rule, name);

  // Report the newly seen rule.
  // FIXME: This is currently encoding the key by merely stripping the
  // non-printable characters. Should probably encode this into a real encoding.
  std::string encoded = rule->key.str();
  encoded.erase(
                std::remove_if(encoded.begin(), encoded.end(),
                               [](char c) -> bool {
                                 return c < 32 || c > 127; }),
                encoded.end());
  fprintf(fp, "{ \"new-rule\", \"%s\", \"%s\" },\n", name, encoded.c_str());

  return result.first->second.c_str();
}